

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O3

void __thiscall
TinyProcessLib::Process::Process
          (Process *this,string_type *command,string_type *path,environment_type *environment,
          function<void_(const_char_*,_unsigned_long)> *read_stdout,
          function<void_(const_char_*,_unsigned_long)> *read_stderr,bool open_stdin,Config *config)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined3 uVar5;
  
  Data::Data(&this->data);
  this->closed = true;
  (this->close_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->close_mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->close_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->close_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->close_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)&(this->read_stdout).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->read_stdout).super__Function_base._M_functor + 8) = 0;
  (this->read_stdout).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->read_stdout)._M_invoker = read_stdout->_M_invoker;
  if ((read_stdout->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar3 = *(undefined8 *)((long)&(read_stdout->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->read_stdout).super__Function_base._M_functor =
         *(undefined8 *)&(read_stdout->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->read_stdout).super__Function_base._M_functor + 8) = uVar3;
    (this->read_stdout).super__Function_base._M_manager =
         (read_stdout->super__Function_base)._M_manager;
    (read_stdout->super__Function_base)._M_manager = (_Manager_type)0x0;
    read_stdout->_M_invoker = (_Invoker_type)0x0;
  }
  *(undefined8 *)&(this->read_stderr).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->read_stderr).super__Function_base._M_functor + 8) = 0;
  (this->read_stderr).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->read_stderr)._M_invoker = read_stderr->_M_invoker;
  if ((read_stderr->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar3 = *(undefined8 *)((long)&(read_stderr->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->read_stderr).super__Function_base._M_functor =
         *(undefined8 *)&(read_stderr->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->read_stderr).super__Function_base._M_functor + 8) = uVar3;
    (this->read_stderr).super__Function_base._M_manager =
         (read_stderr->super__Function_base)._M_manager;
    (read_stderr->super__Function_base)._M_manager = (_Manager_type)0x0;
    read_stderr->_M_invoker = (_Invoker_type)0x0;
  }
  (this->stdout_stderr_thread)._M_id._M_thread = 0;
  this->open_stdin = open_stdin;
  (this->stdin_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->stdin_mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->stdin_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->stdin_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->stdin_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  uVar1 = *(undefined4 *)((long)&config->buffer_size + 4);
  bVar4 = config->inherit_file_descriptors;
  uVar5 = *(undefined3 *)&config->field_0x9;
  uVar2 = *(undefined4 *)&config->field_0xc;
  *(int *)&(this->config).buffer_size = (int)config->buffer_size;
  *(undefined4 *)((long)&(this->config).buffer_size + 4) = uVar1;
  (this->config).inherit_file_descriptors = bVar4;
  *(undefined3 *)&(this->config).field_0x9 = uVar5;
  *(undefined4 *)&(this->config).field_0xc = uVar2;
  (this->stdout_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (int *)0x0;
  (this->stderr_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (int *)0x0;
  (this->stdin_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (int *)0x0;
  open(this,(char *)command,(int)path,environment);
  async_read(this);
  return;
}

Assistant:

Process::Process(const string_type &command, const string_type &path,
                 const environment_type &environment,
                 std::function<void(const char *bytes, size_t n)> read_stdout,
                 std::function<void(const char *bytes, size_t n)> read_stderr,
                 bool open_stdin, const Config &config) noexcept
    : closed(true), read_stdout(std::move(read_stdout)), read_stderr(std::move(read_stderr)), open_stdin(open_stdin), config(config) {
  open(command, path, &environment);
  async_read();
}